

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O0

void Curl_dynhds_init(dynhds *dynhds,size_t max_entries,size_t max_strs_size)

{
  size_t max_strs_size_local;
  size_t max_entries_local;
  dynhds *dynhds_local;
  
  dynhds->hds = (dynhds_entry **)0x0;
  dynhds->strs_len = 0;
  dynhds->hds_allc = 0;
  dynhds->hds_len = 0;
  dynhds->max_entries = max_entries;
  dynhds->max_strs_size = max_strs_size;
  dynhds->opts = 0;
  return;
}

Assistant:

void Curl_dynhds_init(struct dynhds *dynhds, size_t max_entries,
                      size_t max_strs_size)
{
  DEBUGASSERT(dynhds);
  DEBUGASSERT(max_strs_size);
  dynhds->hds = NULL;
  dynhds->hds_len = dynhds->hds_allc = dynhds->strs_len = 0;
  dynhds->max_entries = max_entries;
  dynhds->max_strs_size = max_strs_size;
  dynhds->opts = 0;
}